

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O2

size_t Imf_3_4::bytesPerDeepLineTable
                 (Header *header,int minY,int maxY,char *base,int xStride,int yStride,
                 vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer puVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  Box2i *pBVar12;
  ChannelList *this;
  const_iterator cVar13;
  ConstIterator CVar14;
  size_t sVar15;
  long lVar16;
  uint uVar17;
  int x;
  long lVar18;
  int iVar19;
  int *piVar20;
  int iVar21;
  int iVar22;
  uint64_t nBytes;
  long lVar23;
  int *piVar24;
  uint uVar25;
  
  pBVar12 = Header::dataWindow(header);
  this = Header::channels(header);
  cVar13._M_node = (_Base_ptr)ChannelList::begin(this);
  while( true ) {
    CVar14 = ChannelList::end(this);
    if ((const_iterator)cVar13._M_node == CVar14._i._M_node) break;
    uVar2 = *(uint *)&cVar13._M_node[9]._M_parent;
    uVar17 = -uVar2;
    uVar9 = uVar2;
    if ((int)uVar2 < 1) {
      uVar9 = uVar17;
    }
    uVar3 = *(uint *)&cVar13._M_node[9].field_0x4;
    uVar25 = -uVar3;
    uVar10 = uVar3;
    if ((int)uVar3 < 1) {
      uVar10 = uVar25;
    }
    iVar11 = pixelTypeSize(cVar13._M_node[9]._M_color);
    iVar22 = minY + -1 + uVar9;
    iVar19 = iVar22 % (int)uVar9;
    iVar4 = (pBVar12->min).x;
    iVar5 = (pBVar12->max).x;
    iVar21 = (int)(iVar4 + uVar10 + -1) % (int)uVar10;
    if (uVar3 != uVar25 && SBORROW4(uVar3,uVar25) == (int)(uVar3 * 2) < 0) {
      uVar25 = uVar3;
    }
    if (uVar2 != uVar17 && SBORROW4(uVar2,uVar17) == (int)(uVar2 * 2) < 0) {
      uVar17 = uVar2;
    }
    iVar6 = (pBVar12->min).y;
    puVar7 = (bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    piVar20 = (int *)(base + (long)(int)((minY + -1 + uVar17) - iVar19) * (long)yStride +
                             (long)(int)((iVar4 + uVar25 + -1) - iVar21) * (long)xStride);
    for (lVar16 = (long)(iVar22 - iVar19); lVar16 <= maxY - maxY % (int)uVar9;
        lVar16 = lVar16 + (ulong)uVar9) {
      lVar23 = 0;
      piVar24 = piVar20;
      for (lVar18 = (long)(int)((iVar4 + uVar10 + -1) - iVar21);
          lVar18 <= iVar5 - iVar5 % (int)uVar10; lVar18 = lVar18 + (ulong)uVar10) {
        lVar23 = lVar23 + (long)*piVar24 * (long)iVar11;
        piVar24 = (int *)((long)piVar24 + (ulong)uVar25 * (long)xStride);
      }
      puVar1 = puVar7 + (lVar16 - iVar6);
      *puVar1 = *puVar1 + lVar23;
      piVar20 = (int *)((long)piVar20 + (ulong)uVar17 * (long)yStride);
    }
    cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node);
  }
  sVar15 = 0;
  for (lVar16 = (long)minY; lVar16 <= maxY; lVar16 = lVar16 + 1) {
    uVar8 = (bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_start[lVar16 - (pBVar12->min).y];
    if (sVar15 <= uVar8) {
      sVar15 = uVar8;
    }
  }
  return sVar15;
}

Assistant:

size_t
bytesPerDeepLineTable (
    const Header&   header,
    int             minY,
    int             maxY,
    const char*     base,
    int             xStride,
    int             yStride,
    vector<size_t>& bytesPerLine)
{
    const Box2i&       dataWindow = header.dataWindow ();
    const ChannelList& channels   = header.channels ();

    for (ChannelList::ConstIterator c = channels.begin (); c != channels.end ();
         ++c)
    {
        const int      ySampling = abs (c.channel ().ySampling);
        const int      xSampling = abs (c.channel ().xSampling);
        const uint64_t pixelSize = pixelTypeSize (c.channel ().type);

        // Here we transform from the domain over all pixels into the domain
        // of actual samples.  We want to sample points in [minY, maxY] where
        // (y % ySampling) == 0.  However, doing this by rejecting samples
        // requires O(height*width) modulo computations, which were a
        // significant bottleneck in the previous implementation of this
        // function.  For the low, low price of 4 divisions per channel, we
        // can tighten the y & x ranges to the least and greatest roots of the
        // sampling function and then stride by the sampling rate.
        const int sampleMinY = roundToNextMultiple (minY, ySampling);
        const int sampleMaxY = roundToPrevMultiple (maxY, ySampling);
        const int sampleMinX =
            roundToNextMultiple (dataWindow.min.x, xSampling);
        const int sampleMaxX =
            roundToPrevMultiple (dataWindow.max.x, xSampling);

        for (int y = sampleMinY; y <= sampleMaxY; y += ySampling)
        {
            uint64_t nBytes = 0;
            for (int x = sampleMinX; x <= sampleMaxX; x += xSampling)
            {
                nBytes += pixelSize * static_cast<uint64_t> (sampleCount (
                                          base, xStride, yStride, x, y));
            }

            //
            // architectures where size_t is smaller than 64 bits may overflow
            // (scanlines with more than 2^32 bytes are not currently supported so this should not occur with valid files)
            //
            if (static_cast<uint64_t> (bytesPerLine[y - dataWindow.min.y]) +
                    nBytes >
                SIZE_MAX)
            {
                throw IEX_NAMESPACE::IoExc ("Scanline size too large");
            }

            bytesPerLine[y - dataWindow.min.y] += nBytes;
        }
    }

    size_t maxBytesPerLine = 0;

    for (int y = minY; y <= maxY; ++y)
    {
        if (maxBytesPerLine < bytesPerLine[y - dataWindow.min.y])
        {
            maxBytesPerLine = bytesPerLine[y - dataWindow.min.y];
        }
    }

    return maxBytesPerLine;
}